

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::remove_web_seed(torrent *this,string *url)

{
  __type_conflict1 _Var1;
  iterator web;
  
  web._M_node = (_List_node_base *)&this->m_web_seeds;
  do {
    web._M_node = (web._M_node)->_M_next;
    if (web._M_node == (_List_node_base *)&this->m_web_seeds) {
      return;
    }
    _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (web._M_node + 1),url);
  } while (!_Var1);
  if (*(char *)((long)&web._M_node[0xb]._M_next + 4) == '\0') {
    set_need_save_resume(this,(resume_data_flags_t)0x80);
  }
  remove_web_seed_iter(this,web);
  return;
}

Assistant:

void torrent::remove_web_seed(std::string const& url)
	{
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [&] (web_seed_t const& w) { return w.url == url; });

		if (i != m_web_seeds.end())
		{
			if (!i->ephemeral)
				set_need_save_resume(torrent_handle::if_metadata_changed);
			remove_web_seed_iter(i);
		}
	}